

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

void __thiscall
draco::EntryValue::EntryValue<unsigned_char>
          (EntryValue *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  size_type __n;
  reference __dest;
  const_reference __src;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t total_size;
  size_type in_stack_ffffffffffffffd8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19a065);
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDI,0);
  __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,0);
  memcpy(__dest,__src,__n);
  return;
}

Assistant:

explicit EntryValue(const std::vector<DataTypeT> &data) {
    const size_t total_size = sizeof(DataTypeT) * data.size();
    data_.resize(total_size);
    memcpy(&data_[0], &data[0], total_size);
  }